

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O3

size_t x86_code(lzma_simple *simple,uint32_t now_pos,_Bool is_encoder,uint8_t *buffer,size_t size)

{
  size_t sVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  
  if (size < 5) {
    return 0;
  }
  uVar3 = simple->prev_mask;
  uVar2 = now_pos - 5;
  if (now_pos - simple->prev_pos < 6) {
    uVar2 = simple->prev_pos;
  }
  sVar1 = 0;
  do {
    if ((byte)(buffer[sVar1] + 0x16) < 0xfe) {
      sVar1 = sVar1 + 1;
    }
    else {
      uVar5 = (int)sVar1 + now_pos;
      uVar6 = uVar5 - uVar2;
      uVar4 = 0;
      if (uVar6 < 6) {
        if (uVar5 == uVar2) {
          uVar4 = (ulong)uVar3;
        }
        else {
          iVar7 = uVar6 + (uVar6 == 0);
          uVar4 = (ulong)uVar3;
          do {
            uVar4 = (ulong)(((uint)uVar4 & 0x77) * 2);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      uVar3 = 1;
      uVar6 = (uint)uVar4;
      uVar2 = uVar5;
      if ((byte)(buffer[sVar1 + 4] + 1) < 2) {
        uVar3 = 0x11;
        if ((x86_code::MASK_TO_ALLOWED_STATUS[(uint)(uVar4 >> 1) & 7] == true) && (uVar6 < 0x20)) {
          iVar7 = -5 - uVar5;
          if (is_encoder) {
            iVar7 = uVar5 + 5;
          }
          uVar3 = ((uint)buffer[sVar1 + 1] |
                  (uint)buffer[sVar1 + 2] << 8 |
                  (uint)buffer[sVar1 + 3] << 0x10 | (uint)buffer[sVar1 + 4] << 0x18) + iVar7;
          if (uVar6 != 0) {
            for (; (uVar6 = uVar3 >> ((char)x86_code::MASK_TO_BIT_NUMBER[uVar4 >> 1] * -8 + 0x18U &
                                     0x1f), (char)uVar6 == -1 || ((uVar6 & 0xff) == 0));
                uVar3 = ~(uVar3 ^ -1 << ((char)x86_code::MASK_TO_BIT_NUMBER[uVar4 >> 1] * -8 & 0x1fU
                                        )) + iVar7) {
            }
          }
          buffer[sVar1 + 4] = (uint8_t)((int)(uVar3 << 7) >> 0x1f);
          buffer[sVar1 + 3] = (uint8_t)(uVar3 >> 0x10);
          buffer[sVar1 + 2] = (uint8_t)(uVar3 >> 8);
          buffer[sVar1 + 1] = (uint8_t)uVar3;
          sVar1 = sVar1 + 5;
          uVar3 = 0;
          goto LAB_001bdce5;
        }
      }
      sVar1 = sVar1 + 1;
      uVar3 = uVar3 | uVar6;
    }
LAB_001bdce5:
    if (size - 5 < sVar1) {
      simple->prev_mask = uVar3;
      simple->prev_pos = uVar2;
      return sVar1;
    }
  } while( true );
}

Assistant:

static size_t
x86_code(lzma_simple *simple, uint32_t now_pos, bool is_encoder,
		uint8_t *buffer, size_t size)
{
	static const bool MASK_TO_ALLOWED_STATUS[8]
		= { true, true, true, false, true, false, false, false };

	static const uint32_t MASK_TO_BIT_NUMBER[8]
			= { 0, 1, 2, 2, 3, 3, 3, 3 };

	uint32_t prev_mask = simple->prev_mask;
	uint32_t prev_pos = simple->prev_pos;

	size_t limit;
	size_t buffer_pos;

	if (size < 5)
		return 0;

	if (now_pos - prev_pos > 5)
		prev_pos = now_pos - 5;

	limit = size - 5;
	buffer_pos = 0;

	while (buffer_pos <= limit) {
		uint32_t offset;
		uint32_t i;

		uint8_t b = buffer[buffer_pos];
		if (b != 0xE8 && b != 0xE9) {
			++buffer_pos;
			continue;
		}

		offset = now_pos + (uint32_t)(buffer_pos)
				- prev_pos;
		prev_pos = now_pos + (uint32_t)(buffer_pos);

		if (offset > 5) {
			prev_mask = 0;
		} else {
			for (i = 0; i < offset; ++i) {
				prev_mask &= 0x77;
				prev_mask <<= 1;
			}
		}

		b = buffer[buffer_pos + 4];

		if (Test86MSByte(b)
			&& MASK_TO_ALLOWED_STATUS[(prev_mask >> 1) & 0x7]
				&& (prev_mask >> 1) < 0x10) {

			uint32_t src = ((uint32_t)(b) << 24)
				| ((uint32_t)(buffer[buffer_pos + 3]) << 16)
				| ((uint32_t)(buffer[buffer_pos + 2]) << 8)
				| (buffer[buffer_pos + 1]);

			uint32_t dest;
			while (true) {
				uint32_t i;

				if (is_encoder)
					dest = src + (now_pos + (uint32_t)(
							buffer_pos) + 5);
				else
					dest = src - (now_pos + (uint32_t)(
							buffer_pos) + 5);

				if (prev_mask == 0)
					break;

				i = MASK_TO_BIT_NUMBER[prev_mask >> 1];

				b = (uint8_t)(dest >> (24 - i * 8));

				if (!Test86MSByte(b))
					break;

				src = dest ^ ((1 << (32 - i * 8)) - 1);
			}

			buffer[buffer_pos + 4]
					= (uint8_t)(~(((dest >> 24) & 1) - 1));
			buffer[buffer_pos + 3] = (uint8_t)(dest >> 16);
			buffer[buffer_pos + 2] = (uint8_t)(dest >> 8);
			buffer[buffer_pos + 1] = (uint8_t)(dest);
			buffer_pos += 5;
			prev_mask = 0;

		} else {
			++buffer_pos;
			prev_mask |= 1;
			if (Test86MSByte(b))
				prev_mask |= 0x10;
		}
	}

	simple->prev_mask = prev_mask;
	simple->prev_pos = prev_pos;

	return buffer_pos;
}